

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O2

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::detail::is_new_style_constructor,_char[1],_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::return_value_policy>
    ::init(EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX EVar1;
  ushort uVar2;
  int iVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_R8;
  process_attribute<pybind11::arg_v,_void> *in_R9;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000008;
  process_attribute<pybind11::arg_v,_void> *in_stack_00000010;
  EVP_PKEY_CTX *in_stack_00000018;
  EVP_PKEY_CTX *in_stack_00000020;
  
  *(undefined8 *)in_stack_00000020 = *(undefined8 *)ctx;
  uVar2 = *(ushort *)(in_stack_00000020 + 0x59);
  *(ushort *)(in_stack_00000020 + 0x59) = uVar2 | 0x10;
  *(undefined8 *)(in_stack_00000020 + 0x70) = *in_RSI;
  *(undefined8 *)(in_stack_00000020 + 0x78) = *in_RDX;
  *(ushort *)(in_stack_00000020 + 0x59) = uVar2 | 0x12;
  *(undefined8 *)(in_stack_00000020 + 8) = in_R8;
  process_attribute<pybind11::arg_v,_void>::init(in_R9,in_stack_00000020);
  process_attribute<pybind11::arg_v,_void>::init(in_stack_00000008,in_stack_00000020);
  iVar3 = process_attribute<pybind11::arg_v,_void>::init(in_stack_00000010,in_stack_00000020);
  EVar1 = *in_stack_00000018;
  in_stack_00000020[0x58] = EVar1;
  return CONCAT31((int3)((uint)iVar3 >> 8),EVar1);
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }